

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsReader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::MhsReader::MhsReader(MhsReader *this,IO *io,string *name,Mode mode,Comm *comm)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  IO *__lhs;
  reference ppIVar1;
  undefined8 *in_RSI;
  string *in_RDI;
  int *in_R8;
  int i;
  Params params;
  string *in_stack_00000398;
  IO *in_stack_000003a0;
  shared_ptr<adios2::core::compress::CompressSirius> *in_stack_fffffffffffffc98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffca0;
  IO **in_stack_fffffffffffffca8;
  vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *in_stack_fffffffffffffcb0
  ;
  Engine *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcd0;
  value_type __rhs;
  allocator_type *in_stack_fffffffffffffce0;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffce8;
  int __val;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  Comm *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  Mode in_stack_fffffffffffffd04;
  Mode mode_00;
  string *in_stack_fffffffffffffd08;
  string *name_00;
  IO *in_stack_fffffffffffffd10;
  IO *this_00;
  string *in_stack_fffffffffffffd18;
  Engine *in_stack_fffffffffffffd20;
  allocator *paVar2;
  undefined1 *local_2c8;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  Engine *local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  IO *local_1b8;
  int local_1ac;
  string local_1a8 [32];
  Engine *local_188;
  undefined8 *local_180;
  allocator local_171;
  string local_170;
  undefined1 local_150 [28];
  ArrayOrdering in_stack_fffffffffffffecc;
  string *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  _Base_ptr local_d0;
  size_t local_c8;
  string local_88 [63];
  allocator local_49;
  string local_48 [56];
  undefined8 *local_10;
  
  paVar2 = &local_49;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"MhsReader",paVar2);
  helper::Comm::Comm((Comm *)in_stack_fffffffffffffca0,(Comm *)in_stack_fffffffffffffc98);
  Engine::Engine(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8);
  helper::Comm::~Comm((Comm *)0xe6b842);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *(undefined ***)in_RDI = &PTR__MhsReader_01137f80;
  std::vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::vector
            ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)0xe6b886);
  std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::vector
            ((vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *)0xe6b8a2);
  std::shared_ptr<adios2::core::compress::CompressSirius>::shared_ptr
            ((shared_ptr<adios2::core::compress::CompressSirius> *)0xe6b8be);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Tiers",(allocator *)&stack0xffffffffffffff77);
  helper::GetParameter<int>((Params *)paVar2,in_RDI,in_R8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  local_150[0x17] = 1;
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffcd0,(char (*) [6])in_stack_fffffffffffffcc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcc0);
  local_150[0x17] = 0;
  local_d0 = (_Base_ptr)&stack0xfffffffffffffef0;
  local_c8 = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0xe6b9d1);
  __l._M_len._0_4_ = in_stack_fffffffffffffd00;
  __l._M_array = (iterator)in_stack_fffffffffffffcf8;
  __l._M_len._4_4_ = in_stack_fffffffffffffd04;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(in_stack_fffffffffffffcf0,__l,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xe6ba0d);
  local_2c8 = (undefined1 *)&stack0xffffffffffffff30;
  do {
    local_2c8 = local_2c8 + -0x40;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(in_stack_fffffffffffffca0);
  } while (local_2c8 != &stack0xfffffffffffffef0);
  std::__cxx11::string::~string((string *)(local_150 + 0x18));
  std::
  make_shared<adios2::core::compress::CompressSirius,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffcc8);
  this_00 = (IO *)local_150;
  std::shared_ptr<adios2::core::compress::CompressSirius>::operator=
            ((shared_ptr<adios2::core::compress::CompressSirius> *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98);
  std::shared_ptr<adios2::core::compress::CompressSirius>::~shared_ptr
            ((shared_ptr<adios2::core::compress::CompressSirius> *)0xe6baae);
  paVar2 = &local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",paVar2);
  name_00 = &local_170;
  IO::SetEngine(in_stack_000003a0,in_stack_00000398);
  std::__cxx11::string::~string((string *)name_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  local_180 = local_10;
  std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::emplace_back<adios2::core::IO*>
            ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
             in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  mode_00 = (Mode)((ulong)local_10 >> 0x20);
  std::operator+(in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
  local_188 = IO::Open(this_00,name_00,mode_00);
  std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
  emplace_back<adios2::core::Engine*>
            (in_stack_fffffffffffffcb0,(Engine **)in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_1a8);
  for (local_1ac = 1; local_1ac < *(int *)(in_RDI + 8); local_1ac = local_1ac + 1) {
    __val = (int)((ulong)*local_10 >> 0x20);
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffca8,&in_stack_fffffffffffffca0->first);
    __lhs = ADIOS::DeclareIO((ADIOS *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                             in_stack_fffffffffffffecc);
    local_1b8 = __lhs;
    std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
    emplace_back<adios2::core::IO*>
              ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1f8);
    __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&in_RDI[6].field_2 + 8);
    ppIVar1 = std::vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::back
                        ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
                         in_stack_fffffffffffffca0);
    __rhs = *ppIVar1;
    std::operator+(__lhs_00,(char *)in_stack_fffffffffffffcc0);
    std::__cxx11::to_string(__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    in_stack_fffffffffffffcc0 = IO::Open(this_00,name_00,mode_00);
    local_200 = in_stack_fffffffffffffcc0;
    std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
    emplace_back<adios2::core::Engine*>
              (in_stack_fffffffffffffcb0,(Engine **)in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_240);
  }
  in_RDI[4]._M_dataplus = (_Alloc_hider)0x1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0xe6c085);
  return;
}

Assistant:

MhsReader::MhsReader(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("MhsReader", io, name, mode, std::move(comm))
{
    helper::GetParameter(io.m_Parameters, "Tiers", m_Tiers);
    Params params = {{"Tiers", std::to_string(m_Tiers)}};
    m_SiriusCompressor = std::make_shared<compress::CompressSirius>(params);
    io.SetEngine("");
    m_SubIOs.emplace_back(&io);
    m_SubEngines.emplace_back(&io.Open(m_Name + ".tier0", adios2::Mode::Read));

    for (int i = 1; i < m_Tiers; ++i)
    {
        m_SubIOs.emplace_back(&io.m_ADIOS.DeclareIO("SubIO" + std::to_string(i)));
        m_SubEngines.emplace_back(
            &m_SubIOs.back()->Open(m_Name + ".tier" + std::to_string(i), adios2::Mode::Read));
    }
    m_IsOpen = true;
}